

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  size_type *psVar1;
  pointer puVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  undefined8 *puVar9;
  CfdException *pCVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  wally_tx_input *pwVar12;
  long *plVar13;
  undefined8 uVar14;
  pointer puVar15;
  ulong uVar16;
  wally_tx_input *pwVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string item_key;
  string __str_1;
  Txid txid;
  int ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  pointer *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  pointer local_d8 [2];
  wally_psbt *local_c8;
  unsigned_long local_c0;
  uint local_b4;
  long local_b0;
  wally_psbt *local_a8;
  undefined1 local_a0 [16];
  _func_int *local_90 [2];
  int local_7c;
  string local_78;
  undefined1 local_58 [16];
  unsigned_long *local_48;
  long *local_38;
  
  local_48 = (unsigned_long *)0x0;
  local_58 = (undefined1  [16])0x0;
  local_c0 = 0;
  local_b0 = CONCAT44(local_b0._4_4_,(int)CONCAT71(in_register_00000011,ignore_duplicate_error));
  local_b4 = (uint)ignore_duplicate_error;
  local_c8 = psbt_dest;
  local_a8 = psbt;
  if (psbt_dest->num_inputs != 0) {
    do {
      if (psbt->num_inputs == 0) {
LAB_0035056a:
        if ((unsigned_long *)local_58._8_8_ == local_48) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_58,
                     (iterator)local_58._8_8_,&local_c0);
        }
        else {
          *(unsigned_long *)local_58._8_8_ = local_c0;
          local_58._8_8_ = (unsigned_long *)(local_58._8_8_ + 8);
        }
      }
      else {
        pwVar12 = local_c8->tx->inputs + local_c0;
        bVar8 = false;
        uVar16 = 0;
        do {
          pwVar17 = psbt->tx->inputs;
          bVar5 = true;
          if (pwVar17[uVar16].index == pwVar12->index) {
            pwVar17 = pwVar17 + uVar16;
            auVar19[0] = -(pwVar12->txhash[0] == pwVar17->txhash[0]);
            auVar19[1] = -(pwVar12->txhash[1] == pwVar17->txhash[1]);
            auVar19[2] = -(pwVar12->txhash[2] == pwVar17->txhash[2]);
            auVar19[3] = -(pwVar12->txhash[3] == pwVar17->txhash[3]);
            auVar19[4] = -(pwVar12->txhash[4] == pwVar17->txhash[4]);
            auVar19[5] = -(pwVar12->txhash[5] == pwVar17->txhash[5]);
            auVar19[6] = -(pwVar12->txhash[6] == pwVar17->txhash[6]);
            auVar19[7] = -(pwVar12->txhash[7] == pwVar17->txhash[7]);
            auVar19[8] = -(pwVar12->txhash[8] == pwVar17->txhash[8]);
            auVar19[9] = -(pwVar12->txhash[9] == pwVar17->txhash[9]);
            auVar19[10] = -(pwVar12->txhash[10] == pwVar17->txhash[10]);
            auVar19[0xb] = -(pwVar12->txhash[0xb] == pwVar17->txhash[0xb]);
            auVar19[0xc] = -(pwVar12->txhash[0xc] == pwVar17->txhash[0xc]);
            auVar19[0xd] = -(pwVar12->txhash[0xd] == pwVar17->txhash[0xd]);
            auVar19[0xe] = -(pwVar12->txhash[0xe] == pwVar17->txhash[0xe]);
            auVar19[0xf] = -(pwVar12->txhash[0xf] == pwVar17->txhash[0xf]);
            auVar18[0] = -(pwVar12->txhash[0x10] == pwVar17->txhash[0x10]);
            auVar18[1] = -(pwVar12->txhash[0x11] == pwVar17->txhash[0x11]);
            auVar18[2] = -(pwVar12->txhash[0x12] == pwVar17->txhash[0x12]);
            auVar18[3] = -(pwVar12->txhash[0x13] == pwVar17->txhash[0x13]);
            auVar18[4] = -(pwVar12->txhash[0x14] == pwVar17->txhash[0x14]);
            auVar18[5] = -(pwVar12->txhash[0x15] == pwVar17->txhash[0x15]);
            auVar18[6] = -(pwVar12->txhash[0x16] == pwVar17->txhash[0x16]);
            auVar18[7] = -(pwVar12->txhash[0x17] == pwVar17->txhash[0x17]);
            auVar18[8] = -(pwVar12->txhash[0x18] == pwVar17->txhash[0x18]);
            auVar18[9] = -(pwVar12->txhash[0x19] == pwVar17->txhash[0x19]);
            auVar18[10] = -(pwVar12->txhash[0x1a] == pwVar17->txhash[0x1a]);
            auVar18[0xb] = -(pwVar12->txhash[0x1b] == pwVar17->txhash[0x1b]);
            auVar18[0xc] = -(pwVar12->txhash[0x1c] == pwVar17->txhash[0x1c]);
            auVar18[0xd] = -(pwVar12->txhash[0x1d] == pwVar17->txhash[0x1d]);
            auVar18[0xe] = -(pwVar12->txhash[0x1e] == pwVar17->txhash[0x1e]);
            auVar18[0xf] = -(pwVar12->txhash[0x1f] == pwVar17->txhash[0x1f]);
            auVar18 = auVar18 & auVar19;
            if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
              ByteData::ByteData((ByteData *)local_128,pwVar17->txhash,0x20);
              ByteData256::ByteData256((ByteData256 *)&local_108,(ByteData *)local_128);
              Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_108._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_128._0_8_);
              }
              Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
              local_128._0_8_ = &local_118;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_128,local_78._M_dataplus._M_p,
                         local_78._M_dataplus._M_p + local_78._M_string_length);
              ::std::__cxx11::string::append(local_128);
              uVar3 = pwVar17->index;
              cVar7 = '\x01';
              if (9 < uVar3) {
                uVar11 = uVar3;
                cVar6 = '\x04';
                do {
                  cVar7 = cVar6;
                  if (uVar11 < 100) {
                    cVar7 = cVar7 + -2;
                    goto LAB_003503bd;
                  }
                  if (uVar11 < 1000) {
                    cVar7 = cVar7 + -1;
                    goto LAB_003503bd;
                  }
                  if (uVar11 < 10000) goto LAB_003503bd;
                  bVar8 = 99999 < uVar11;
                  uVar11 = uVar11 / 10000;
                  cVar6 = cVar7 + '\x04';
                } while (bVar8);
                cVar7 = cVar7 + '\x01';
              }
LAB_003503bd:
              local_e8 = local_d8;
              ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar7);
              ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,local_e0,uVar3);
              uVar14 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._0_8_ != &local_118) {
                uVar14 = local_118._M_allocated_capacity;
              }
              puVar2 = (pointer)(CONCAT44(uStack_dc,local_e0) +
                                CONCAT44(local_128._12_4_,local_128._8_4_));
              if ((ulong)uVar14 < puVar2) {
                puVar15 = (pointer)0xf;
                if (local_e8 != local_d8) {
                  puVar15 = local_d8[0];
                }
                if (puVar15 < puVar2) goto LAB_00350430;
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::replace
                                   ((ulong)&local_e8,0,(char *)0x0,local_128._0_8_);
              }
              else {
LAB_00350430:
                puVar9 = (undefined8 *)::std::__cxx11::string::_M_append(local_128,(ulong)local_e8);
              }
              psVar1 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_108.field_2._M_allocated_capacity = *psVar1;
                local_108.field_2._8_8_ = puVar9[3];
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              }
              else {
                local_108.field_2._M_allocated_capacity = *psVar1;
                local_108._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_108._M_string_length = puVar9[1];
              *puVar9 = psVar1;
              puVar9[1] = 0;
              *(undefined1 *)psVar1 = 0;
              if (local_e8 != local_d8) {
                operator_delete(local_e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._0_8_ != &local_118) {
                operator_delete((void *)local_128._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p);
              }
              if (pwVar17->sequence != pwVar12->sequence && (char)local_b0 == '\0') {
                local_128._0_8_ = "cfdcore_psbt.cpp";
                local_128._8_4_ = 0x26b;
                local_118._M_allocated_capacity = 0x5ea00c;
                logger::log<std::__cxx11::string&>
                          ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                           "psbt sequence duplicate. [{}]",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108);
                pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
                local_128._0_8_ = &local_118;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_128,"psbt sequence duplicate error.","");
                CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_128);
                __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
              }
              MergePsbtInputItem(local_a8->inputs + uVar16,local_c8->inputs + local_c0,
                                 SUB41(local_b4,0),&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p);
              }
              psbt = local_a8;
              local_a0._0_8_ = &PTR__Txid_00735400;
              if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
                operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
              }
              bVar8 = true;
              bVar5 = false;
            }
          }
        } while ((bVar5) && (uVar16 = uVar16 + 1, uVar16 < psbt->num_inputs));
        if (!bVar8) goto LAB_0035056a;
      }
      local_c0 = local_c0 + 1;
    } while (local_c0 < local_c8->num_inputs);
  }
  local_38 = (long *)local_58._8_8_;
  if (local_58._0_8_ != local_58._8_8_) {
    plVar13 = (long *)local_58._0_8_;
    do {
      lVar4 = *plVar13;
      uVar16 = psbt->num_inputs;
      local_b0 = lVar4;
      local_7c = wally_psbt_add_input_at(psbt,(uint32_t)uVar16,1,local_c8->tx->inputs + lVar4);
      if (local_7c != 0) {
        local_a0._0_8_ = "cfdcore_psbt.cpp";
        local_a0._8_4_ = 0x27f;
        local_90[0] = (_func_int *)0x5ea00c;
        logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                          "wally_psbt_add_input_at NG[{}]",&local_7c);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a0._0_8_ = local_a0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"psbt add global unkonwns error.","");
        CfdException::CfdException(pCVar10,kCfdMemoryFullError,(string *)local_a0);
        __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pwVar12 = local_c8->tx->inputs + lVar4;
      ByteData::ByteData((ByteData *)local_128,pwVar12->txhash,0x20);
      ByteData256::ByteData256((ByteData256 *)&local_108,(ByteData *)local_128);
      Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
      Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
      local_128._0_8_ = &local_118;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      ::std::__cxx11::string::append(local_128);
      uVar3 = pwVar12->index;
      cVar7 = '\x01';
      if (9 < uVar3) {
        uVar11 = uVar3;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (uVar11 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00350723;
          }
          if (uVar11 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00350723;
          }
          if (uVar11 < 10000) goto LAB_00350723;
          bVar8 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar8);
        cVar7 = cVar7 + '\x01';
      }
LAB_00350723:
      local_e8 = local_d8;
      ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,local_e0,uVar3);
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        uVar14 = local_118._M_allocated_capacity;
      }
      puVar2 = (pointer)(CONCAT44(uStack_dc,local_e0) + CONCAT44(local_128._12_4_,local_128._8_4_));
      if ((ulong)uVar14 < puVar2) {
        puVar15 = (pointer)0xf;
        if (local_e8 != local_d8) {
          puVar15 = local_d8[0];
        }
        if (puVar15 < puVar2) goto LAB_00350792;
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_128._0_8_);
      }
      else {
LAB_00350792:
        puVar9 = (undefined8 *)::std::__cxx11::string::_M_append(local_128,(ulong)local_e8);
      }
      psVar1 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108.field_2._8_8_ = puVar9[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_108._M_string_length = puVar9[1];
      *puVar9 = psVar1;
      puVar9[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      psbt = local_a8;
      MergePsbtInputItem(local_a8->inputs + (uVar16 & 0xffffffff),local_c8->inputs + local_b0,
                         SUB41(local_b4,0),&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      local_a0._0_8_ = &PTR__Txid_00735400;
      if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
      }
      plVar13 = plVar13 + 1;
    } while (plVar13 != local_38);
  }
  if ((void *)local_58._0_8_ != (void *)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  return;
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}